

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BVHLoader.cpp
# Opt level: O0

void __thiscall Assimp::BVHLoader::ReadHierarchy(BVHLoader *this,aiScene *pScene)

{
  bool bVar1;
  aiNode *paVar2;
  allocator<char> local_69;
  string local_68;
  undefined1 local_38 [8];
  string root;
  aiScene *pScene_local;
  BVHLoader *this_local;
  
  root.field_2._8_8_ = pScene;
  GetNextToken_abi_cxx11_((string *)local_38,this);
  bVar1 = std::operator!=((string *)local_38,"ROOT");
  if (!bVar1) {
    paVar2 = ReadNode(this);
    *(aiNode **)(root.field_2._8_8_ + 8) = paVar2;
    std::__cxx11::string::~string((string *)local_38);
    return;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"Expected root node \"ROOT\".",&local_69);
  ThrowException(this,&local_68);
}

Assistant:

void BVHLoader::ReadHierarchy( aiScene* pScene)
{
    std::string root = GetNextToken();
    if( root != "ROOT")
        ThrowException( "Expected root node \"ROOT\".");

    // Go read the hierarchy from here
    pScene->mRootNode = ReadNode();
}